

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConcaveCollisionAlgorithm::getAllContactManifolds
          (btConvexConcaveCollisionAlgorithm *this,btManifoldArray *manifoldArray)

{
  btPersistentManifold **in_RDI;
  btAlignedObjectArray<btPersistentManifold_*> *unaff_retaddr;
  
  if (in_RDI[0xe] != (btPersistentManifold *)0x0) {
    btAlignedObjectArray<btPersistentManifold_*>::push_back(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void	btConvexConcaveCollisionAlgorithm::getAllContactManifolds(btManifoldArray&	manifoldArray)
{
	if (m_btConvexTriangleCallback.m_manifoldPtr)
	{
		manifoldArray.push_back(m_btConvexTriangleCallback.m_manifoldPtr);
	}
}